

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::LogToSinks
               (LogSeverity severity,char *full_filename,char *base_filename,int line,tm *tm_time,
               char *message,size_t message_len)

{
  size_type sVar1;
  reference ppLVar2;
  int local_4c;
  int i;
  ReaderMutexLock l;
  char *message_local;
  tm *tm_time_local;
  int line_local;
  char *base_filename_local;
  char *full_filename_local;
  LogSeverity severity_local;
  
  l.mu_ = (Mutex *)message;
  ::glog_internal_namespace_::ReaderMutexLock::ReaderMutexLock
            ((ReaderMutexLock *)&stack0xffffffffffffffb8,(Mutex *)sink_mutex_);
  if (sinks_ != (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    sVar1 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::size(sinks_);
    local_4c = (int)sVar1;
    while (local_4c = local_4c + -1, -1 < local_4c) {
      ppLVar2 = std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::operator[]
                          (sinks_,(long)local_4c);
      (*(*ppLVar2)->_vptr_LogSink[2])
                (*ppLVar2,(ulong)(uint)severity,full_filename,base_filename,(ulong)(uint)line,
                 tm_time,l.mu_,message_len);
    }
  }
  ::glog_internal_namespace_::ReaderMutexLock::~ReaderMutexLock
            ((ReaderMutexLock *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

inline void LogDestination::LogToSinks(LogSeverity severity,
                                       const char *full_filename,
                                       const char *base_filename,
                                       int line,
                                       const struct ::tm* tm_time,
                                       const char* message,
                                       size_t message_len) {
  ReaderMutexLock l(&sink_mutex_);
  if (sinks_) {
    for (int i = sinks_->size() - 1; i >= 0; i--) {
      (*sinks_)[i]->send(severity, full_filename, base_filename,
                         line, tm_time, message, message_len);
    }
  }
}